

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

int __thiscall CVmObjStringBuffer::compare_str(CVmObjStringBuffer *this,char *str)

{
  int iVar1;
  wchar_t wVar2;
  int *piVar3;
  wchar_t wVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  char *p;
  long lVar8;
  int local_38;
  
  piVar3 = (int *)(this->super_CVmObject).ext_;
  iVar1 = *piVar3;
  p = str + 2;
  sVar6 = utf8_ptr::s_len(p,(ulong)*(ushort *)str);
  lVar8 = 0;
  iVar7 = 0;
  if (0 < iVar1) {
    iVar7 = iVar1;
  }
  for (; iVar7 != (int)lVar8; lVar8 = lVar8 + 1) {
    wVar2 = piVar3[lVar8 + 3];
    wVar4 = utf8_ptr::s_getch(p);
    if (wVar2 < wVar4) {
      iVar7 = -1;
      goto LAB_00271243;
    }
    if (wVar4 < wVar2) break;
    p = utf8_ptr::s_inc(p);
  }
  iVar7 = 1;
LAB_00271243:
  local_38 = (int)sVar6;
  iVar5 = iVar1 - local_38;
  if ((int)lVar8 < iVar1) {
    iVar5 = iVar7;
  }
  return iVar5;
}

Assistant:

int CVmObjStringBuffer::compare_str(const char *str) const
{
    /* get the buffer pointers and character lengths */
    const wchar_t *p1 = get_ext()->buf;
    utf8_ptr p2((char *)str + VMB_LEN);
    int32_t len1 = get_ext()->len, len2 = p2.len(vmb_get_len(str));

    /* compare character by character */
    for (int32_t i = 0 ; i < len1 ; ++i, ++p1, p2.inc())
    {
        wchar_t c1 = *p1, c2 = p2.getch();
        if (c1 < c2)
            return -1;
        else if (c1 > c2)
            return 1;
    }

    /* 
     *   the strings are equal up to the length of the shorter string; the
     *   longer string compares higher 
     */
    return len1 - len2;
}